

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

Gia_Man_t *
Gia_ManCorrSpecReduce(Gia_Man_t *p,int nFrames,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int local_1ac;
  int iObjNew;
  int iPrevNew;
  int iObj;
  int iPrev;
  int i;
  int f;
  Vec_Int_t *vXorLits;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fRings_local;
  Vec_Int_t **pvOutputs_local;
  int fScorr_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x70,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar2 = Gia_ManRegNum(p);
  if (0 < iVar2) {
    if (p->pReprs == (Gia_Rpr_t *)0x0) {
      __assert_fail("p->pReprs != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0x72,
                    "Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)");
    }
    iVar2 = Gia_ManObjNum(p);
    Vec_IntFill(&p->vCopies,(nFrames + fScorr) * iVar2,-1);
    Gia_ManSetPhase(p);
    iVar2 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(nFrames * iVar2);
    pcVar6 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar6;
    Gia_ManHashAlloc(p_00);
    pGVar7 = Gia_ManConst0(p);
    Gia_ObjSetCopyF(p,0,pGVar7,0);
    iObj = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar10 = false;
      if (iObj < iVar2) {
        iVar2 = Gia_ManPiNum(p);
        pRepr = Gia_ManCi(p,iVar2 + iObj);
        bVar10 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ManAppendCi(p_00);
      Gia_ObjSetCopyF(p,0,pRepr,iVar2);
      iObj = iObj + 1;
    }
    iObj = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar10 = false;
      if (iObj < iVar2) {
        iVar2 = Gia_ManPiNum(p);
        pRepr = Gia_ManCi(p,iVar2 + iObj);
        bVar10 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjId(p,pRepr);
      pGVar7 = Gia_ObjReprObj(p,iVar2);
      if (pGVar7 != (Gia_Obj_t *)0x0) {
        iVar2 = Gia_ObjCopyF(p,0,pGVar7);
        Gia_ObjSetCopyF(p,0,pRepr,iVar2);
      }
      iObj = iObj + 1;
    }
    for (iPrev = 0; iPrev < nFrames + fScorr; iPrev = iPrev + 1) {
      pGVar7 = Gia_ManConst0(p);
      Gia_ObjSetCopyF(p,iPrev,pGVar7,0);
      iObj = 0;
      while( true ) {
        iVar2 = Gia_ManPiNum(p);
        bVar10 = false;
        if (iObj < iVar2) {
          pRepr = Gia_ManCi(p,iObj);
          bVar10 = pRepr != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ManAppendCi(p_00);
        Gia_ObjSetCopyF(p,iPrev,pRepr,iVar2);
        iObj = iObj + 1;
      }
    }
    pVVar8 = Vec_IntAlloc(1000);
    *pvOutputs = pVVar8;
    pVVar8 = Vec_IntAlloc(1000);
    if (fRings == 0) {
      iObj = 1;
      while( true ) {
        bVar10 = false;
        if (iObj < p->nObjs) {
          pRepr = Gia_ManObj(p,iObj);
          bVar10 = pRepr != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ObjId(p,pRepr);
        pGVar7 = Gia_ObjReprObj(p,iVar2);
        if (pGVar7 != (Gia_Obj_t *)0x0) {
          iVar2 = Gia_ObjIsConst(p,iObj);
          if (iVar2 == 0) {
            local_1ac = Gia_ManCorrSpecReal(p_00,p,pGVar7,nFrames,0);
          }
          else {
            local_1ac = 0;
          }
          iVar2 = Gia_ManCorrSpecReal(p_00,p,pRepr,nFrames,0);
          uVar4 = Gia_ObjPhase(pGVar7);
          uVar5 = Gia_ObjPhase(pRepr);
          iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
          if (local_1ac != iVar2) {
            pVVar1 = *pvOutputs;
            iVar3 = Gia_ObjId(p,pGVar7);
            Vec_IntPush(pVVar1,iVar3);
            pVVar1 = *pvOutputs;
            iVar3 = Gia_ObjId(p,pRepr);
            Vec_IntPush(pVVar1,iVar3);
            iVar2 = Gia_ManHashXor(p_00,local_1ac,iVar2);
            Vec_IntPush(pVVar8,iVar2);
          }
        }
        iObj = iObj + 1;
      }
    }
    else {
      iObj = 1;
      while( true ) {
        bVar10 = false;
        if (iObj < p->nObjs) {
          pRepr = Gia_ManObj(p,iObj);
          bVar10 = pRepr != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ObjIsConst(p,iObj);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsHead(p,iObj);
          if (iVar2 != 0) {
            iPrevNew = iObj;
            iVar2 = Gia_ObjIsHead(p,iObj);
            if (iVar2 == 0) {
              __assert_fail("Gia_ObjIsHead(p, i)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                            ,0x99,
                            "Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)"
                           );
            }
            for (iObjNew = Gia_ObjNext(p,iObj); iObjNew != 0; iObjNew = Gia_ObjNext(p,iObjNew)) {
              pGVar7 = Gia_ManObj(p,iPrevNew);
              iVar2 = Gia_ManCorrSpecReal(p_00,p,pGVar7,nFrames,0);
              pGVar7 = Gia_ManObj(p,iObjNew);
              iVar3 = Gia_ManCorrSpecReal(p_00,p,pGVar7,nFrames,0);
              uVar4 = Gia_ObjPhase(pRepr);
              pGVar7 = Gia_ManObj(p,iPrevNew);
              uVar5 = Gia_ObjPhase(pGVar7);
              iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
              uVar4 = Gia_ObjPhase(pRepr);
              pGVar7 = Gia_ManObj(p,iObjNew);
              uVar5 = Gia_ObjPhase(pGVar7);
              iVar3 = Abc_LitNotCond(iVar3,uVar4 ^ uVar5);
              if (((iVar2 != iVar3) && (iVar2 != 0)) && (iVar3 != 1)) {
                Vec_IntPush(*pvOutputs,iPrevNew);
                Vec_IntPush(*pvOutputs,iObjNew);
                iVar3 = Abc_LitNot(iVar3);
                iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
                Vec_IntPush(pVVar8,iVar2);
              }
              iPrevNew = iObjNew;
            }
            pGVar7 = Gia_ManObj(p,iPrevNew);
            iVar2 = Gia_ManCorrSpecReal(p_00,p,pGVar7,nFrames,0);
            pGVar7 = Gia_ManObj(p,iObj);
            iVar3 = Gia_ManCorrSpecReal(p_00,p,pGVar7,nFrames,0);
            uVar4 = Gia_ObjPhase(pRepr);
            pGVar7 = Gia_ManObj(p,iPrevNew);
            uVar5 = Gia_ObjPhase(pGVar7);
            iVar2 = Abc_LitNotCond(iVar2,uVar4 ^ uVar5);
            uVar4 = Gia_ObjPhase(pRepr);
            pGVar7 = Gia_ManObj(p,iObj);
            uVar5 = Gia_ObjPhase(pGVar7);
            iVar3 = Abc_LitNotCond(iVar3,uVar4 ^ uVar5);
            if (((iVar2 != iVar3) && (iVar2 != 0)) && (iVar3 != 1)) {
              Vec_IntPush(*pvOutputs,iPrevNew);
              Vec_IntPush(*pvOutputs,iObj);
              iVar3 = Abc_LitNot(iVar3);
              iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
              Vec_IntPush(pVVar8,iVar2);
            }
          }
        }
        else {
          iVar2 = Gia_ManCorrSpecReal(p_00,p,pRepr,nFrames,0);
          iVar3 = Gia_ObjPhase(pRepr);
          iVar2 = Abc_LitNotCond(iVar2,iVar3);
          if (iVar2 != 0) {
            Vec_IntPush(*pvOutputs,0);
            Vec_IntPush(*pvOutputs,iObj);
            Vec_IntPush(pVVar8,iVar2);
          }
        }
        iObj = iObj + 1;
      }
    }
    for (iObj = 0; iVar2 = Vec_IntSize(pVVar8), iObj < iVar2; iObj = iObj + 1) {
      iVar2 = Vec_IntEntry(pVVar8,iObj);
      Gia_ManAppendCo(p_00,iVar2);
    }
    Vec_IntFree(pVVar8);
    Gia_ManHashStop(p_00);
    Vec_IntErase(&p->vCopies);
    pGVar9 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar9;
  }
  __assert_fail("Gia_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                ,0x71,"Gia_Man_t *Gia_ManCorrSpecReduce(Gia_Man_t *, int, int, Vec_Int_t **, int)");
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduce( Gia_Man_t * p, int nFrames, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrev, iObj, iPrevNew, iObjNew;
    assert( nFrames > 0 );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ObjSetCopyF( p, 0, Gia_ManConst0(p), 0 );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
            Gia_ObjSetCopyF( p, 0, pObj, Gia_ObjCopyF(p, 0, pRepr) );
    for ( f = 0; f < nFrames+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    if ( fRings )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsConst( p, i ) )
            {
                iObjNew = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
                iObjNew = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pObj) );
                if ( iObjNew != 0 )
                {
                    Vec_IntPush( *pvOutputs, 0 );
                    Vec_IntPush( *pvOutputs, i );
                    Vec_IntPush( vXorLits, iObjNew );
                }
            }
            else if ( Gia_ObjIsHead( p, i ) )
            {
                iPrev = i;
                Gia_ClassForEachObj1( p, i, iObj )
                {
                    iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                    iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                    iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                    iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                    if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                    {
                        Vec_IntPush( *pvOutputs, iPrev );
                        Vec_IntPush( *pvOutputs, iObj );
                        Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                    }
                    iPrev = iObj;
                }
                iObj = i;
                iPrevNew = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iPrev), nFrames, 0 );
                iObjNew  = Gia_ManCorrSpecReal( pNew, p, Gia_ManObj(p, iObj), nFrames, 0 );
                iPrevNew = Abc_LitNotCond( iPrevNew, Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iPrev)) );
                iObjNew  = Abc_LitNotCond( iObjNew,  Gia_ObjPhase(pObj) ^ Gia_ObjPhase(Gia_ManObj(p, iObj)) );
                if ( iPrevNew != iObjNew && iPrevNew != 0 && iObjNew != 1 )
                {
                    Vec_IntPush( *pvOutputs, iPrev );
                    Vec_IntPush( *pvOutputs, iObj );
                    Vec_IntPush( vXorLits, Gia_ManHashAnd(pNew, iPrevNew, Abc_LitNot(iObjNew)) );
                }
            }
        }
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, nFrames, 0 );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, nFrames, 0 );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}